

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_base.hpp
# Opt level: O2

size_t jessilib::encode_codepoint_utf16<char16_t,std::__cxx11::u16string>
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                  *out_destination,char32_t in_codepoint)

{
  undefined8 uStack_20;
  
  if ((uint)in_codepoint < 0x110000) {
    if ((uint)in_codepoint < 0x10000) {
      uStack_20 = 1;
    }
    else {
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(out_destination,(short)((uint)(in_codepoint + L'\x03ff0000') >> 10) + L'\xd800');
      in_codepoint = in_codepoint & 0x3ffU | 0xdc00;
      uStack_20 = 2;
    }
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    push_back(out_destination,(char16_t)in_codepoint);
  }
  else {
    uStack_20 = 0;
  }
  return uStack_20;
}

Assistant:

constexpr size_t encode_codepoint_utf16(T& out_destination, char32_t in_codepoint) {
	if (in_codepoint > 0x10FFFF) {
		return 0;
	}

	if (in_codepoint <= 0xFFFF) {
		// 1-unit sequence
		impl_unicode::append_helper(out_destination, static_cast<CharT>(in_codepoint));
		return 1;
	}

	// 2-unit sequence
	in_codepoint -= 0x10000;
	impl_unicode::append_helper(out_destination, static_cast<CharT>((in_codepoint >> 10) + 0xD800));
	impl_unicode::append_helper(out_destination, static_cast<CharT>((in_codepoint & 0x03FF) + 0xDC00));
	return 2;
}